

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::IFF_PDU::IFF_PDU
          (IFF_PDU *this,EntityIdentifier *EmittingID,EntityIdentifier *EventID,Vector *Location,
          SystemIdentifier *ID,FundamentalOperationalData *FOD)

{
  undefined8 uVar1;
  KUINT16 KVar2;
  KFLOAT32 KVar3;
  anon_union_1_2_a45434d2_for_SystemIdentifier_4 aVar4;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IFF_PDU_00221518;
  (this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c08;
  KVar2 = (EmittingID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (EmittingID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220b10;
  *(undefined2 *)&(this->m_EmittingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EmittingID->super_SimulationIdentifier).field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c08;
  KVar2 = (EventID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (EventID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220b10;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EventID->super_SimulationIdentifier).field_0xc;
  (this->m_Location).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223d98;
  KVar3 = Location->m_f32Y;
  (this->m_Location).m_f32X = Location->m_f32X;
  (this->m_Location).m_f32Y = KVar3;
  (this->m_Location).m_f32Z = Location->m_f32Z;
  (this->m_SystemID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SystemIdentifier_002256a8;
  KVar2 = ID->m_ui16SystemName;
  (this->m_SystemID).m_ui16SystemType = ID->m_ui16SystemType;
  (this->m_SystemID).m_ui16SystemName = KVar2;
  aVar4 = ID->field_3;
  (this->m_SystemID).m_ui8SystemMode = ID->m_ui8SystemMode;
  (this->m_SystemID).field_3 = aVar4;
  this->m_ui8SystemDesignator = '\0';
  this->m_ui8SystemSpecific = '\0';
  (this->m_FOD).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__FundamentalOperationalData_00224228;
  uVar1 = *(undefined8 *)((long)&FOD->field_0 + 8);
  *(undefined8 *)&(this->m_FOD).field_0 = *(undefined8 *)&FOD->field_0;
  *(undefined8 *)((long)&(this->m_FOD).field_0 + 8) = uVar1;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x1c';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

IFF_PDU::IFF_PDU( const EntityIdentifier & EmittingID, const EntityIdentifier & EventID, const Vector & Location,
        const SystemIdentifier & ID, const FundamentalOperationalData & FOD ) :
    m_EmittingEntityID( EmittingID ),
    m_EventID( EventID ),
    m_Location( Location ),
    m_SystemID( ID ),
    m_FOD( FOD ),
	m_ui8SystemDesignator( 0 ),
	m_ui8SystemSpecific( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = IFF_ATC_NAVAIDS_PDU_Type;
    m_ui16PDULength = IFF_PDU_SIZE;

	#if DIS_VERSION > 6
	m_ui8ProtocolVersion = IEEE_1278_1_2012;
	#else 
	m_ui8ProtocolVersion = IEEE_1278_1A_1998;
	#endif
}